

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void dynet::logsumexp<dynet::Device_CPU>(Device_CPU *dev,Tensor *x,Tensor *m,Tensor *z)

{
  uint uVar1;
  float *pfVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  DefaultDevice *pDVar9;
  ulong uVar10;
  ulong uVar11;
  char *__function;
  ulong uVar12;
  ulong uVar13;
  ushort uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  int iVar41;
  CoeffReturnType CVar42;
  real rVar43;
  uint uVar44;
  CoeffReturnType CVar45;
  CoeffReturnType CVar46;
  float fVar47;
  SumReducer<float> reducer_2;
  vector<float,_std::allocator<float>_> mvals;
  MaxReducer<float,_0> reducer;
  TensorEvaluator<const_Eigen::TensorAssignOp<Eigen::TensorChippingOp<0L,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorChippingOp<0L,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::DefaultDevice>
  evaluator;
  SumReducer<float> local_1b9;
  XprType local_1b8;
  type local_1a8;
  vector<float,_std::allocator<float>_> local_188;
  type local_170;
  undefined1 local_130 [24];
  undefined1 local_118 [56];
  array<Index,_NumPreservedStrides> local_e0;
  undefined1 local_d8 [16];
  array<Index,_NumReducedDims> local_c8;
  array<Index,_NumReducedDims> local_c0;
  _Type local_b8;
  DefaultDevice *local_a8;
  Dimensions local_a0;
  float *local_40;
  
  uVar44 = (x->d).bd;
  pDVar9 = (DefaultDevice *)(long)(int)uVar44;
  if (pDVar9 != (DefaultDevice *)0x1) {
    uVar44 = (x->d).nd;
    uVar10 = (ulong)uVar44;
    if (uVar10 == 0) {
      uVar44 = 1;
    }
    else {
      if (uVar44 == 1) goto LAB_0034c910;
      auVar16 = vpbroadcastq_avx512f();
      auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar12 = 0;
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar20 = vmovdqa64_avx512f(auVar17);
        auVar17 = vpbroadcastq_avx512f();
        auVar21 = vporq_avx512f(auVar17,auVar18);
        auVar17 = vporq_avx512f(auVar17,auVar19);
        uVar6 = vpcmpuq_avx512f(auVar17,auVar16,2);
        bVar7 = (byte)uVar6;
        uVar6 = vpcmpuq_avx512f(auVar21,auVar16,2);
        bVar8 = (byte)uVar6;
        uVar14 = CONCAT11(bVar8,bVar7);
        auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])((x->d).d + uVar12));
        auVar17._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar21._4_4_;
        auVar17._0_4_ = (uint)(bVar7 & 1) * auVar21._0_4_;
        auVar17._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar21._8_4_;
        auVar17._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar21._12_4_;
        auVar17._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar21._16_4_;
        auVar17._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar21._20_4_;
        auVar17._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar21._24_4_;
        auVar17._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar21._28_4_;
        auVar17._32_4_ = (uint)(bVar8 & 1) * auVar21._32_4_;
        auVar17._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar21._36_4_;
        auVar17._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar21._40_4_;
        auVar17._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar21._44_4_;
        auVar17._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar21._48_4_;
        auVar17._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar21._52_4_;
        auVar17._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar21._56_4_;
        auVar17._60_4_ = (uint)(bVar8 >> 7) * auVar21._60_4_;
        auVar17 = vpmulld_avx512f(auVar17,auVar20);
        uVar12 = uVar12 + 0x10;
      } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
      auVar17 = vmovdqa32_avx512f(auVar17);
      auVar16._0_4_ = (uint)(bVar7 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
      bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
      auVar16._4_4_ = (uint)bVar3 * auVar17._4_4_ | (uint)!bVar3 * auVar20._4_4_;
      bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
      auVar16._8_4_ = (uint)bVar3 * auVar17._8_4_ | (uint)!bVar3 * auVar20._8_4_;
      bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
      auVar16._12_4_ = (uint)bVar3 * auVar17._12_4_ | (uint)!bVar3 * auVar20._12_4_;
      bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
      auVar16._16_4_ = (uint)bVar3 * auVar17._16_4_ | (uint)!bVar3 * auVar20._16_4_;
      bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
      auVar16._20_4_ = (uint)bVar3 * auVar17._20_4_ | (uint)!bVar3 * auVar20._20_4_;
      bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
      auVar16._24_4_ = (uint)bVar3 * auVar17._24_4_ | (uint)!bVar3 * auVar20._24_4_;
      bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
      auVar16._28_4_ = (uint)bVar3 * auVar17._28_4_ | (uint)!bVar3 * auVar20._28_4_;
      auVar16._32_4_ =
           (uint)(bVar8 & 1) * auVar17._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
      bVar3 = (bool)(bVar8 >> 1 & 1);
      auVar16._36_4_ = (uint)bVar3 * auVar17._36_4_ | (uint)!bVar3 * auVar20._36_4_;
      bVar3 = (bool)(bVar8 >> 2 & 1);
      auVar16._40_4_ = (uint)bVar3 * auVar17._40_4_ | (uint)!bVar3 * auVar20._40_4_;
      bVar3 = (bool)(bVar8 >> 3 & 1);
      auVar16._44_4_ = (uint)bVar3 * auVar17._44_4_ | (uint)!bVar3 * auVar20._44_4_;
      bVar3 = (bool)(bVar8 >> 4 & 1);
      auVar16._48_4_ = (uint)bVar3 * auVar17._48_4_ | (uint)!bVar3 * auVar20._48_4_;
      bVar3 = (bool)(bVar8 >> 5 & 1);
      auVar16._52_4_ = (uint)bVar3 * auVar17._52_4_ | (uint)!bVar3 * auVar20._52_4_;
      bVar3 = (bool)(bVar8 >> 6 & 1);
      auVar16._56_4_ = (uint)bVar3 * auVar17._56_4_ | (uint)!bVar3 * auVar20._56_4_;
      auVar16._60_4_ =
           (uint)(bVar8 >> 7) * auVar17._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
      auVar15 = vextracti64x4_avx512f(auVar16,1);
      auVar16 = vpmulld_avx512f(auVar16,ZEXT3264(auVar15));
      auVar4 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
      auVar5 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(auVar4,0x55);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      uVar44 = auVar4._0_4_;
    }
    if (uVar44 != (x->d).d[0]) {
LAB_0034d35a:
      __assert_fail("d.ndims() == 1 || d.batch_size() == d.rows()",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                    ,0xf0,
                    "const Eigen::TensorMap<Eigen::Tensor<float, 2>> dynet::Tensor::tb() const");
    }
LAB_0034c910:
    local_130._0_8_ = x->v;
    uVar44 = 1;
    if (uVar10 != 0) {
      uVar44 = (x->d).d[0];
    }
    local_130._8_8_ = SEXT48((int)uVar44);
    local_118._0_4_ = 0;
    uVar10 = (ulong)(m->d).nd;
    local_130._16_8_ = pDVar9;
    if (uVar10 != 0) {
      auVar16 = vpbroadcastq_avx512f();
      auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar12 = 0;
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar20 = vmovdqa64_avx512f(auVar17);
        auVar17 = vpbroadcastq_avx512f();
        auVar21 = vporq_avx512f(auVar17,auVar18);
        auVar17 = vporq_avx512f(auVar17,auVar19);
        uVar6 = vpcmpuq_avx512f(auVar17,auVar16,2);
        bVar7 = (byte)uVar6;
        uVar6 = vpcmpuq_avx512f(auVar21,auVar16,2);
        bVar8 = (byte)uVar6;
        uVar14 = CONCAT11(bVar8,bVar7);
        auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])((m->d).d + uVar12));
        auVar21._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar17._4_4_;
        auVar21._0_4_ = (uint)(bVar7 & 1) * auVar17._0_4_;
        auVar21._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar17._8_4_;
        auVar21._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar17._12_4_;
        auVar21._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar17._16_4_;
        auVar21._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar17._20_4_;
        auVar21._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar17._24_4_;
        auVar21._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar17._28_4_;
        auVar21._32_4_ = (uint)(bVar8 & 1) * auVar17._32_4_;
        auVar21._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar17._36_4_;
        auVar21._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar17._40_4_;
        auVar21._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar17._44_4_;
        auVar21._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar17._48_4_;
        auVar21._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar17._52_4_;
        auVar21._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar17._56_4_;
        auVar21._60_4_ = (uint)(bVar8 >> 7) * auVar17._60_4_;
        auVar17 = vpmulld_avx512f(auVar21,auVar20);
        uVar12 = uVar12 + 0x10;
      } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
      auVar16 = vmovdqa32_avx512f(auVar17);
      auVar18._0_4_ = (uint)(bVar7 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
      bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
      auVar18._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * auVar20._4_4_;
      bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
      auVar18._8_4_ = (uint)bVar3 * auVar16._8_4_ | (uint)!bVar3 * auVar20._8_4_;
      bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
      auVar18._12_4_ = (uint)bVar3 * auVar16._12_4_ | (uint)!bVar3 * auVar20._12_4_;
      bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
      auVar18._16_4_ = (uint)bVar3 * auVar16._16_4_ | (uint)!bVar3 * auVar20._16_4_;
      bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
      auVar18._20_4_ = (uint)bVar3 * auVar16._20_4_ | (uint)!bVar3 * auVar20._20_4_;
      bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
      auVar18._24_4_ = (uint)bVar3 * auVar16._24_4_ | (uint)!bVar3 * auVar20._24_4_;
      bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
      auVar18._28_4_ = (uint)bVar3 * auVar16._28_4_ | (uint)!bVar3 * auVar20._28_4_;
      auVar18._32_4_ =
           (uint)(bVar8 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
      bVar3 = (bool)(bVar8 >> 1 & 1);
      auVar18._36_4_ = (uint)bVar3 * auVar16._36_4_ | (uint)!bVar3 * auVar20._36_4_;
      bVar3 = (bool)(bVar8 >> 2 & 1);
      auVar18._40_4_ = (uint)bVar3 * auVar16._40_4_ | (uint)!bVar3 * auVar20._40_4_;
      bVar3 = (bool)(bVar8 >> 3 & 1);
      auVar18._44_4_ = (uint)bVar3 * auVar16._44_4_ | (uint)!bVar3 * auVar20._44_4_;
      bVar3 = (bool)(bVar8 >> 4 & 1);
      auVar18._48_4_ = (uint)bVar3 * auVar16._48_4_ | (uint)!bVar3 * auVar20._48_4_;
      bVar3 = (bool)(bVar8 >> 5 & 1);
      auVar18._52_4_ = (uint)bVar3 * auVar16._52_4_ | (uint)!bVar3 * auVar20._52_4_;
      bVar3 = (bool)(bVar8 >> 6 & 1);
      auVar18._56_4_ = (uint)bVar3 * auVar16._56_4_ | (uint)!bVar3 * auVar20._56_4_;
      auVar18._60_4_ =
           (uint)(bVar8 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
      auVar15 = vextracti64x4_avx512f(auVar18,1);
      auVar16 = vpmulld_avx512f(auVar18,ZEXT3264(auVar15));
      auVar4 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
      auVar5 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(auVar4,0x55);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      if (auVar4._0_4_ != 1) {
LAB_0034d338:
        __assert_fail("d.batch_size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                      ,0xe4,"Eigen::TensorMap<Eigen::Tensor<float, 1>> dynet::Tensor::tb()");
      }
    }
    local_1a8.m_xpr.m_data = m->v;
    local_1a8.m_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(long)(int)(m->d).bd;
    local_170.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)local_130;
    local_170.m_xpr.m_xpr.m_xpr.m_data = (StoragePointerType)&local_1a8;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorReductionOp<Eigen::internal::MaxReducer<float,_0>,_const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorReductionOp<Eigen::internal::MaxReducer<float,_0>,_const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>
           *)&local_170,dev->edevice);
    as_vector(&local_188,m);
    uVar44 = (x->d).bd;
    uVar10 = (ulong)uVar44;
    if (uVar44 != 0) {
      uVar12 = 0;
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        uVar44 = (x->d).nd;
        uVar11 = (ulong)uVar44;
        if (uVar11 == 0) {
          uVar44 = 1;
LAB_0034cb3a:
          if (uVar44 != (x->d).d[0]) goto LAB_0034d35a;
        }
        else if (uVar44 != 1) {
          auVar18 = vpbroadcastq_avx512f();
          uVar13 = 0;
          auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar20 = vmovdqa64_avx512f(auVar19);
            auVar19 = vpbroadcastq_avx512f();
            auVar21 = vporq_avx512f(auVar19,auVar16);
            auVar19 = vporq_avx512f(auVar19,auVar17);
            uVar6 = vpcmpuq_avx512f(auVar19,auVar18,2);
            bVar7 = (byte)uVar6;
            uVar6 = vpcmpuq_avx512f(auVar21,auVar18,2);
            bVar8 = (byte)uVar6;
            uVar14 = CONCAT11(bVar8,bVar7);
            auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])((x->d).d + uVar13));
            auVar19._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar21._4_4_;
            auVar19._0_4_ = (uint)(bVar7 & 1) * auVar21._0_4_;
            auVar19._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar21._8_4_;
            auVar19._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar21._12_4_;
            auVar19._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar21._16_4_;
            auVar19._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar21._20_4_;
            auVar19._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar21._24_4_;
            auVar19._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar21._28_4_;
            auVar19._32_4_ = (uint)(bVar8 & 1) * auVar21._32_4_;
            auVar19._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar21._36_4_;
            auVar19._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar21._40_4_;
            auVar19._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar21._44_4_;
            auVar19._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar21._48_4_;
            auVar19._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar21._52_4_;
            auVar19._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar21._56_4_;
            auVar19._60_4_ = (uint)(bVar8 >> 7) * auVar21._60_4_;
            auVar19 = vpmulld_avx512f(auVar19,auVar20);
            uVar13 = uVar13 + 0x10;
          } while ((uVar11 + 0xf & 0x1fffffff0) != uVar13);
          auVar18 = vmovdqa32_avx512f(auVar19);
          auVar28._0_4_ =
               (uint)(bVar7 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
          bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar28._4_4_ = (uint)bVar3 * auVar18._4_4_ | (uint)!bVar3 * auVar20._4_4_;
          bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar28._8_4_ = (uint)bVar3 * auVar18._8_4_ | (uint)!bVar3 * auVar20._8_4_;
          bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar28._12_4_ = (uint)bVar3 * auVar18._12_4_ | (uint)!bVar3 * auVar20._12_4_;
          bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
          auVar28._16_4_ = (uint)bVar3 * auVar18._16_4_ | (uint)!bVar3 * auVar20._16_4_;
          bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
          auVar28._20_4_ = (uint)bVar3 * auVar18._20_4_ | (uint)!bVar3 * auVar20._20_4_;
          bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
          auVar28._24_4_ = (uint)bVar3 * auVar18._24_4_ | (uint)!bVar3 * auVar20._24_4_;
          bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
          auVar28._28_4_ = (uint)bVar3 * auVar18._28_4_ | (uint)!bVar3 * auVar20._28_4_;
          auVar28._32_4_ =
               (uint)(bVar8 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
          bVar3 = (bool)(bVar8 >> 1 & 1);
          auVar28._36_4_ = (uint)bVar3 * auVar18._36_4_ | (uint)!bVar3 * auVar20._36_4_;
          bVar3 = (bool)(bVar8 >> 2 & 1);
          auVar28._40_4_ = (uint)bVar3 * auVar18._40_4_ | (uint)!bVar3 * auVar20._40_4_;
          bVar3 = (bool)(bVar8 >> 3 & 1);
          auVar28._44_4_ = (uint)bVar3 * auVar18._44_4_ | (uint)!bVar3 * auVar20._44_4_;
          bVar3 = (bool)(bVar8 >> 4 & 1);
          auVar28._48_4_ = (uint)bVar3 * auVar18._48_4_ | (uint)!bVar3 * auVar20._48_4_;
          bVar3 = (bool)(bVar8 >> 5 & 1);
          auVar28._52_4_ = (uint)bVar3 * auVar18._52_4_ | (uint)!bVar3 * auVar20._52_4_;
          bVar3 = (bool)(bVar8 >> 6 & 1);
          auVar28._56_4_ = (uint)bVar3 * auVar18._56_4_ | (uint)!bVar3 * auVar20._56_4_;
          auVar28._60_4_ =
               (uint)(bVar8 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
          auVar15 = vextracti64x4_avx512f(auVar28,1);
          auVar18 = vpmulld_avx512f(auVar28,ZEXT3264(auVar15));
          auVar4 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
          auVar5 = vpshufd_avx(auVar4,0xee);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          auVar5 = vpshufd_avx(auVar4,0x55);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          uVar44 = auVar4._0_4_;
          goto LAB_0034cb3a;
        }
        uVar44 = 1;
        if (uVar11 != 0) {
          uVar44 = (x->d).d[0];
        }
        local_170.m_xpr.m_xpr.m_xpr.m_data = x->v;
        local_170.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
             (array<long,_1>)(long)(int)uVar44;
        local_170.m_xpr.m_xpr.m_offset = (Index)(int)uVar10;
        local_170.m_functor.m_value =
             local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
        uVar10 = (ulong)(z->d).nd;
        local_170.m_xpr.m_xpr._24_8_ = uVar12;
        if (uVar10 != 0) {
          auVar18 = vpbroadcastq_avx512f();
          uVar11 = 0;
          auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar20 = vmovdqa64_avx512f(auVar19);
            auVar19 = vpbroadcastq_avx512f();
            auVar21 = vporq_avx512f(auVar19,auVar16);
            auVar19 = vporq_avx512f(auVar19,auVar17);
            uVar6 = vpcmpuq_avx512f(auVar19,auVar18,2);
            bVar7 = (byte)uVar6;
            uVar6 = vpcmpuq_avx512f(auVar21,auVar18,2);
            bVar8 = (byte)uVar6;
            uVar14 = CONCAT11(bVar8,bVar7);
            auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((z->d).d + uVar11));
            auVar29._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar19._4_4_;
            auVar29._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
            auVar29._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar19._8_4_;
            auVar29._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar19._12_4_;
            auVar29._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar19._16_4_;
            auVar29._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar19._20_4_;
            auVar29._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar19._24_4_;
            auVar29._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar19._28_4_;
            auVar29._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
            auVar29._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
            auVar29._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
            auVar29._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
            auVar29._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
            auVar29._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
            auVar29._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
            auVar29._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
            auVar19 = vpmulld_avx512f(auVar29,auVar20);
            uVar11 = uVar11 + 0x10;
          } while ((uVar10 + 0xf & 0x1fffffff0) != uVar11);
          auVar16 = vmovdqa32_avx512f(auVar19);
          auVar30._0_4_ =
               (uint)(bVar7 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
          bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar30._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * auVar20._4_4_;
          bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar30._8_4_ = (uint)bVar3 * auVar16._8_4_ | (uint)!bVar3 * auVar20._8_4_;
          bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar30._12_4_ = (uint)bVar3 * auVar16._12_4_ | (uint)!bVar3 * auVar20._12_4_;
          bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
          auVar30._16_4_ = (uint)bVar3 * auVar16._16_4_ | (uint)!bVar3 * auVar20._16_4_;
          bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
          auVar30._20_4_ = (uint)bVar3 * auVar16._20_4_ | (uint)!bVar3 * auVar20._20_4_;
          bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
          auVar30._24_4_ = (uint)bVar3 * auVar16._24_4_ | (uint)!bVar3 * auVar20._24_4_;
          bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
          auVar30._28_4_ = (uint)bVar3 * auVar16._28_4_ | (uint)!bVar3 * auVar20._28_4_;
          auVar30._32_4_ =
               (uint)(bVar8 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
          bVar3 = (bool)(bVar8 >> 1 & 1);
          auVar30._36_4_ = (uint)bVar3 * auVar16._36_4_ | (uint)!bVar3 * auVar20._36_4_;
          bVar3 = (bool)(bVar8 >> 2 & 1);
          auVar30._40_4_ = (uint)bVar3 * auVar16._40_4_ | (uint)!bVar3 * auVar20._40_4_;
          bVar3 = (bool)(bVar8 >> 3 & 1);
          auVar30._44_4_ = (uint)bVar3 * auVar16._44_4_ | (uint)!bVar3 * auVar20._44_4_;
          bVar3 = (bool)(bVar8 >> 4 & 1);
          auVar30._48_4_ = (uint)bVar3 * auVar16._48_4_ | (uint)!bVar3 * auVar20._48_4_;
          bVar3 = (bool)(bVar8 >> 5 & 1);
          auVar30._52_4_ = (uint)bVar3 * auVar16._52_4_ | (uint)!bVar3 * auVar20._52_4_;
          bVar3 = (bool)(bVar8 >> 6 & 1);
          auVar30._56_4_ = (uint)bVar3 * auVar16._56_4_ | (uint)!bVar3 * auVar20._56_4_;
          auVar30._60_4_ =
               (uint)(bVar8 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
          auVar15 = vextracti64x4_avx512f(auVar30,1);
          auVar16 = vpmulld_avx512f(auVar30,ZEXT3264(auVar15));
          auVar4 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
          auVar5 = vpshufd_avx(auVar4,0xee);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          auVar5 = vpshufd_avx(auVar4,0x55);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          if (auVar4._0_4_ != 1) goto LAB_0034d338;
        }
        local_1a8.m_xpr.m_data = z->v;
        local_1a8.m_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
             (array<long,_1>)(long)(int)(z->d).bd;
        local_1b8.m_lhs_xpr = &local_1a8;
        local_1b8.m_rhs_xpr = &local_170;
        local_1a8.m_offset = uVar12;
        Eigen::
        TensorEvaluator<const_Eigen::TensorAssignOp<Eigen::TensorChippingOp<0L,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::MakePointer>_>,_Eigen::DefaultDevice>
        ::TensorEvaluator((TensorEvaluator<const_Eigen::TensorAssignOp<Eigen::TensorChippingOp<0L,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::MakePointer>_>,_Eigen::DefaultDevice>
                           *)local_130,(XprType *)&local_1b8,dev->edevice);
        auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        if (local_40 == (float *)0x0) {
          fVar47 = Eigen::internal::
                   InnerMostDimReducer<Eigen::TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::MakePointer>,_Eigen::DefaultDevice>,_Eigen::internal::SumReducer<float>,_true,_true>
                   ::reduce((TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                             *)(local_118 + 0x30),0,(Index)local_e0._M_elems[0],&local_1b9);
          auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        }
        else {
          fVar47 = *local_40;
        }
        if (local_130._8_8_ != 1) {
LAB_0034d316:
          __assert_fail("m_stride == 1",
                        "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorChipping.h",
                        0x172,
                        "Index Eigen::TensorEvaluator<const Eigen::TensorChippingOp<0, Eigen::TensorMap<Eigen::Tensor<float, 1>>>, Eigen::DefaultDevice>::srcCoeff(Index) const [Derived = const Eigen::TensorChippingOp<0, Eigen::TensorMap<Eigen::Tensor<float, 1>>>, Device = Eigen::DefaultDevice]"
                       );
        }
        if (local_118._8_8_ == 0) {
LAB_0034d2f4:
          __function = 
          "CoeffReturnType &Eigen::TensorEvaluator<Eigen::TensorMap<Eigen::Tensor<float, 1>>, Eigen::DefaultDevice>::coeffRef(Index) [Derived = Eigen::TensorMap<Eigen::Tensor<float, 1>>, Device = Eigen::DefaultDevice]"
          ;
          goto LAB_0034d309;
        }
        *(float *)(local_118._8_8_ + local_130._16_8_ * 4) = fVar47;
        if (local_40 != (float *)0x0) {
          free(*(void **)(local_40 + -2));
          auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          local_40 = (float *)0x0;
        }
        uVar10 = (ulong)(z->d).nd;
        if (uVar10 != 0) {
          auVar18 = vpbroadcastq_avx512f();
          uVar11 = 0;
          auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar20 = vmovdqa64_avx512f(auVar19);
            auVar19 = vpbroadcastq_avx512f();
            auVar21 = vporq_avx512f(auVar19,auVar17);
            auVar19 = vporq_avx512f(auVar19,auVar16);
            uVar6 = vpcmpuq_avx512f(auVar19,auVar18,2);
            bVar7 = (byte)uVar6;
            uVar6 = vpcmpuq_avx512f(auVar21,auVar18,2);
            bVar8 = (byte)uVar6;
            uVar14 = CONCAT11(bVar8,bVar7);
            auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((z->d).d + uVar11));
            auVar31._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar19._4_4_;
            auVar31._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
            auVar31._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar19._8_4_;
            auVar31._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar19._12_4_;
            auVar31._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar19._16_4_;
            auVar31._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar19._20_4_;
            auVar31._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar19._24_4_;
            auVar31._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar19._28_4_;
            auVar31._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
            auVar31._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
            auVar31._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
            auVar31._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
            auVar31._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
            auVar31._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
            auVar31._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
            auVar31._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
            auVar19 = vpmulld_avx512f(auVar31,auVar20);
            uVar11 = uVar11 + 0x10;
          } while ((uVar10 + 0xf & 0x1fffffff0) != uVar11);
          auVar18 = vmovdqa32_avx512f(auVar19);
          auVar32._0_4_ =
               (uint)(bVar7 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
          bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar32._4_4_ = (uint)bVar3 * auVar18._4_4_ | (uint)!bVar3 * auVar20._4_4_;
          bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar32._8_4_ = (uint)bVar3 * auVar18._8_4_ | (uint)!bVar3 * auVar20._8_4_;
          bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar32._12_4_ = (uint)bVar3 * auVar18._12_4_ | (uint)!bVar3 * auVar20._12_4_;
          bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
          auVar32._16_4_ = (uint)bVar3 * auVar18._16_4_ | (uint)!bVar3 * auVar20._16_4_;
          bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
          auVar32._20_4_ = (uint)bVar3 * auVar18._20_4_ | (uint)!bVar3 * auVar20._20_4_;
          bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
          auVar32._24_4_ = (uint)bVar3 * auVar18._24_4_ | (uint)!bVar3 * auVar20._24_4_;
          bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
          auVar32._28_4_ = (uint)bVar3 * auVar18._28_4_ | (uint)!bVar3 * auVar20._28_4_;
          auVar32._32_4_ =
               (uint)(bVar8 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
          bVar3 = (bool)(bVar8 >> 1 & 1);
          auVar32._36_4_ = (uint)bVar3 * auVar18._36_4_ | (uint)!bVar3 * auVar20._36_4_;
          bVar3 = (bool)(bVar8 >> 2 & 1);
          auVar32._40_4_ = (uint)bVar3 * auVar18._40_4_ | (uint)!bVar3 * auVar20._40_4_;
          bVar3 = (bool)(bVar8 >> 3 & 1);
          auVar32._44_4_ = (uint)bVar3 * auVar18._44_4_ | (uint)!bVar3 * auVar20._44_4_;
          bVar3 = (bool)(bVar8 >> 4 & 1);
          auVar32._48_4_ = (uint)bVar3 * auVar18._48_4_ | (uint)!bVar3 * auVar20._48_4_;
          bVar3 = (bool)(bVar8 >> 5 & 1);
          auVar32._52_4_ = (uint)bVar3 * auVar18._52_4_ | (uint)!bVar3 * auVar20._52_4_;
          bVar3 = (bool)(bVar8 >> 6 & 1);
          auVar32._56_4_ = (uint)bVar3 * auVar18._56_4_ | (uint)!bVar3 * auVar20._56_4_;
          auVar32._60_4_ =
               (uint)(bVar8 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
          auVar15 = vextracti64x4_avx512f(auVar32,1);
          auVar18 = vpmulld_avx512f(auVar32,ZEXT3264(auVar15));
          auVar4 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
          auVar5 = vpshufd_avx(auVar4,0xee);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          auVar5 = vpshufd_avx(auVar4,0x55);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          if (auVar4._0_4_ != 1) goto LAB_0034d338;
        }
        local_170.m_xpr.m_xpr.m_xpr.m_data = z->v;
        local_170.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
             (array<long,_1>)(long)(int)(z->d).bd;
        local_170.m_functor.m_value =
             local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
        local_170.m_xpr.m_xpr.m_offset = uVar12;
        if (uVar10 != 0) {
          auVar18 = vpbroadcastq_avx512f();
          uVar11 = 0;
          auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar20 = vmovdqa64_avx512f(auVar19);
            auVar19 = vpbroadcastq_avx512f();
            auVar21 = vporq_avx512f(auVar19,auVar17);
            auVar19 = vporq_avx512f(auVar19,auVar16);
            uVar6 = vpcmpuq_avx512f(auVar19,auVar18,2);
            bVar7 = (byte)uVar6;
            uVar6 = vpcmpuq_avx512f(auVar21,auVar18,2);
            bVar8 = (byte)uVar6;
            uVar14 = CONCAT11(bVar8,bVar7);
            auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((z->d).d + uVar11));
            auVar33._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar19._4_4_;
            auVar33._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
            auVar33._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar19._8_4_;
            auVar33._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar19._12_4_;
            auVar33._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar19._16_4_;
            auVar33._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar19._20_4_;
            auVar33._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar19._24_4_;
            auVar33._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar19._28_4_;
            auVar33._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
            auVar33._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
            auVar33._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
            auVar33._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
            auVar33._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
            auVar33._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
            auVar33._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
            auVar33._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
            auVar19 = vpmulld_avx512f(auVar33,auVar20);
            uVar11 = uVar11 + 0x10;
          } while ((uVar10 + 0xf & 0x1fffffff0) != uVar11);
          auVar16 = vmovdqa32_avx512f(auVar19);
          auVar34._0_4_ =
               (uint)(bVar7 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
          bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar34._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * auVar20._4_4_;
          bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar34._8_4_ = (uint)bVar3 * auVar16._8_4_ | (uint)!bVar3 * auVar20._8_4_;
          bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar34._12_4_ = (uint)bVar3 * auVar16._12_4_ | (uint)!bVar3 * auVar20._12_4_;
          bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
          auVar34._16_4_ = (uint)bVar3 * auVar16._16_4_ | (uint)!bVar3 * auVar20._16_4_;
          bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
          auVar34._20_4_ = (uint)bVar3 * auVar16._20_4_ | (uint)!bVar3 * auVar20._20_4_;
          bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
          auVar34._24_4_ = (uint)bVar3 * auVar16._24_4_ | (uint)!bVar3 * auVar20._24_4_;
          bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
          auVar34._28_4_ = (uint)bVar3 * auVar16._28_4_ | (uint)!bVar3 * auVar20._28_4_;
          auVar34._32_4_ =
               (uint)(bVar8 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
          bVar3 = (bool)(bVar8 >> 1 & 1);
          auVar34._36_4_ = (uint)bVar3 * auVar16._36_4_ | (uint)!bVar3 * auVar20._36_4_;
          bVar3 = (bool)(bVar8 >> 2 & 1);
          auVar34._40_4_ = (uint)bVar3 * auVar16._40_4_ | (uint)!bVar3 * auVar20._40_4_;
          bVar3 = (bool)(bVar8 >> 3 & 1);
          auVar34._44_4_ = (uint)bVar3 * auVar16._44_4_ | (uint)!bVar3 * auVar20._44_4_;
          bVar3 = (bool)(bVar8 >> 4 & 1);
          auVar34._48_4_ = (uint)bVar3 * auVar16._48_4_ | (uint)!bVar3 * auVar20._48_4_;
          bVar3 = (bool)(bVar8 >> 5 & 1);
          auVar34._52_4_ = (uint)bVar3 * auVar16._52_4_ | (uint)!bVar3 * auVar20._52_4_;
          bVar3 = (bool)(bVar8 >> 6 & 1);
          auVar34._56_4_ = (uint)bVar3 * auVar16._56_4_ | (uint)!bVar3 * auVar20._56_4_;
          auVar34._60_4_ =
               (uint)(bVar8 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
          auVar15 = vextracti64x4_avx512f(auVar34,1);
          auVar16 = vpmulld_avx512f(auVar34,ZEXT3264(auVar15));
          auVar4 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
          auVar5 = vpshufd_avx(auVar4,0xee);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          auVar5 = vpshufd_avx(auVar4,0x55);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          if (auVar4._0_4_ != 1) goto LAB_0034d338;
        }
        local_1b8.m_lhs_xpr = &local_1a8;
        local_1b8.m_rhs_xpr = &local_170;
        local_1a8.m_xpr.m_data = local_170.m_xpr.m_xpr.m_xpr.m_data;
        local_1a8.m_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
             local_170.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_1>._M_elems[0];
        local_1a8.m_offset = uVar12;
        Eigen::
        TensorEvaluator<const_Eigen::TensorAssignOp<Eigen::TensorChippingOp<0L,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorChippingOp<0L,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::DefaultDevice>
        ::TensorEvaluator((TensorEvaluator<const_Eigen::TensorAssignOp<Eigen::TensorChippingOp<0L,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorChippingOp<0L,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::DefaultDevice>
                           *)local_130,&local_1b8,dev->edevice);
        CVar45 = Eigen::
                 TensorEvaluator<const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorChippingOp<0L,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice>
                 ::coeff((TensorEvaluator<const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorChippingOp<0L,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice>
                          *)local_d8,0);
        if (local_130._8_8_ != 1) goto LAB_0034d316;
        auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        if (local_118._8_8_ == 0) goto LAB_0034d2f4;
        *(float *)(local_118._8_8_ + local_130._16_8_ * 4) = CVar45 + local_e0._M_elems[0]._0_4_;
        uVar12 = uVar12 + 1;
        uVar10 = (ulong)(x->d).bd;
      } while (uVar12 < uVar10);
    }
    if (local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) {
      return;
    }
    operator_delete(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
    return;
  }
  uVar1 = (x->d).nd;
  uVar10 = (ulong)uVar1;
  if (uVar10 == 0) {
    iVar41 = 1;
LAB_0034c681:
    if (uVar44 * iVar41 != (x->d).d[0]) goto LAB_0034d39e;
  }
  else if (uVar1 != 1) {
    auVar16 = vpbroadcastq_avx512f();
    auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar12 = 0;
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar20 = vmovdqa64_avx512f(auVar17);
      auVar17 = vpbroadcastq_avx512f();
      auVar21 = vporq_avx512f(auVar17,auVar18);
      auVar17 = vporq_avx512f(auVar17,auVar19);
      uVar6 = vpcmpuq_avx512f(auVar17,auVar16,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar21,auVar16,2);
      bVar8 = (byte)uVar6;
      uVar14 = CONCAT11(bVar8,bVar7);
      auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])((x->d).d + uVar12));
      auVar22._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar17._4_4_;
      auVar22._0_4_ = (uint)(bVar7 & 1) * auVar17._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar17._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar17._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar17._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar17._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar17._24_4_;
      auVar22._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar17._28_4_;
      auVar22._32_4_ = (uint)(bVar8 & 1) * auVar17._32_4_;
      auVar22._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar17._36_4_;
      auVar22._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar17._40_4_;
      auVar22._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar17._44_4_;
      auVar22._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar17._48_4_;
      auVar22._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar17._52_4_;
      auVar22._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar17._56_4_;
      auVar22._60_4_ = (uint)(bVar8 >> 7) * auVar17._60_4_;
      auVar17 = vpmulld_avx512f(auVar22,auVar20);
      uVar12 = uVar12 + 0x10;
    } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
    auVar16 = vmovdqa32_avx512f(auVar17);
    auVar23._0_4_ = (uint)(bVar7 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
    bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
    auVar23._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * auVar20._4_4_;
    bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
    auVar23._8_4_ = (uint)bVar3 * auVar16._8_4_ | (uint)!bVar3 * auVar20._8_4_;
    bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
    auVar23._12_4_ = (uint)bVar3 * auVar16._12_4_ | (uint)!bVar3 * auVar20._12_4_;
    bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
    auVar23._16_4_ = (uint)bVar3 * auVar16._16_4_ | (uint)!bVar3 * auVar20._16_4_;
    bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
    auVar23._20_4_ = (uint)bVar3 * auVar16._20_4_ | (uint)!bVar3 * auVar20._20_4_;
    bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
    auVar23._24_4_ = (uint)bVar3 * auVar16._24_4_ | (uint)!bVar3 * auVar20._24_4_;
    bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
    auVar23._28_4_ = (uint)bVar3 * auVar16._28_4_ | (uint)!bVar3 * auVar20._28_4_;
    auVar23._32_4_ = (uint)(bVar8 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar23._36_4_ = (uint)bVar3 * auVar16._36_4_ | (uint)!bVar3 * auVar20._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar23._40_4_ = (uint)bVar3 * auVar16._40_4_ | (uint)!bVar3 * auVar20._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar23._44_4_ = (uint)bVar3 * auVar16._44_4_ | (uint)!bVar3 * auVar20._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar23._48_4_ = (uint)bVar3 * auVar16._48_4_ | (uint)!bVar3 * auVar20._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar23._52_4_ = (uint)bVar3 * auVar16._52_4_ | (uint)!bVar3 * auVar20._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar23._56_4_ = (uint)bVar3 * auVar16._56_4_ | (uint)!bVar3 * auVar20._56_4_;
    auVar23._60_4_ =
         (uint)(bVar8 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
    auVar15 = vextracti64x4_avx512f(auVar23,1);
    auVar16 = vpmulld_avx512f(auVar23,ZEXT3264(auVar15));
    auVar4 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar41 = auVar4._0_4_;
    goto LAB_0034c681;
  }
  uVar44 = 1;
  if (uVar10 != 0) {
    uVar44 = (x->d).d[0];
  }
  if ((m->d).bd != 1) goto LAB_0034d37c;
  uVar10 = (ulong)(m->d).nd;
  if (uVar10 == 0) {
    iVar41 = 1;
  }
  else {
    auVar16 = vpbroadcastq_avx512f();
    auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar12 = 0;
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar20 = vmovdqa64_avx512f(auVar17);
      auVar17 = vpbroadcastq_avx512f();
      auVar21 = vporq_avx512f(auVar17,auVar18);
      auVar17 = vporq_avx512f(auVar17,auVar19);
      uVar6 = vpcmpuq_avx512f(auVar17,auVar16,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar21,auVar16,2);
      bVar8 = (byte)uVar6;
      uVar14 = CONCAT11(bVar8,bVar7);
      auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])((m->d).d + uVar12));
      auVar24._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar17._4_4_;
      auVar24._0_4_ = (uint)(bVar7 & 1) * auVar17._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar17._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar17._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar17._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar17._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar17._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar17._28_4_;
      auVar24._32_4_ = (uint)(bVar8 & 1) * auVar17._32_4_;
      auVar24._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar17._36_4_;
      auVar24._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar17._40_4_;
      auVar24._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar17._44_4_;
      auVar24._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar17._48_4_;
      auVar24._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar17._52_4_;
      auVar24._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar17._56_4_;
      auVar24._60_4_ = (uint)(bVar8 >> 7) * auVar17._60_4_;
      auVar17 = vpmulld_avx512f(auVar24,auVar20);
      uVar12 = uVar12 + 0x10;
    } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
    auVar16 = vmovdqa32_avx512f(auVar17);
    auVar25._0_4_ = (uint)(bVar7 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
    bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
    auVar25._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * auVar20._4_4_;
    bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
    auVar25._8_4_ = (uint)bVar3 * auVar16._8_4_ | (uint)!bVar3 * auVar20._8_4_;
    bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
    auVar25._12_4_ = (uint)bVar3 * auVar16._12_4_ | (uint)!bVar3 * auVar20._12_4_;
    bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
    auVar25._16_4_ = (uint)bVar3 * auVar16._16_4_ | (uint)!bVar3 * auVar20._16_4_;
    bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
    auVar25._20_4_ = (uint)bVar3 * auVar16._20_4_ | (uint)!bVar3 * auVar20._20_4_;
    bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
    auVar25._24_4_ = (uint)bVar3 * auVar16._24_4_ | (uint)!bVar3 * auVar20._24_4_;
    bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
    auVar25._28_4_ = (uint)bVar3 * auVar16._28_4_ | (uint)!bVar3 * auVar20._28_4_;
    auVar25._32_4_ = (uint)(bVar8 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar25._36_4_ = (uint)bVar3 * auVar16._36_4_ | (uint)!bVar3 * auVar20._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar25._40_4_ = (uint)bVar3 * auVar16._40_4_ | (uint)!bVar3 * auVar20._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar25._44_4_ = (uint)bVar3 * auVar16._44_4_ | (uint)!bVar3 * auVar20._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar25._48_4_ = (uint)bVar3 * auVar16._48_4_ | (uint)!bVar3 * auVar20._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar25._52_4_ = (uint)bVar3 * auVar16._52_4_ | (uint)!bVar3 * auVar20._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar25._56_4_ = (uint)bVar3 * auVar16._56_4_ | (uint)!bVar3 * auVar20._56_4_;
    auVar25._60_4_ =
         (uint)(bVar8 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
    auVar15 = vextracti64x4_avx512f(auVar25,1);
    auVar16 = vpmulld_avx512f(auVar25,ZEXT3264(auVar15));
    auVar4 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar41 = auVar4._0_4_;
  }
  if (iVar41 != 1) goto LAB_0034d37c;
  local_118._48_8_ = x->v;
  local_118._8_8_ = SEXT48((int)uVar44);
  local_130._0_8_ = m->v;
  local_130._16_8_ = dev->edevice;
  local_c8._M_elems[0] = (_Type)0;
  local_118[0] = (_Type)0x1;
  local_118._32_8_ = 1;
  local_118._24_8_ = local_118._8_8_;
  local_118._40_8_ = local_118._8_8_;
  local_e0._M_elems[0] = (_Type)(_Type)local_118._8_8_;
  local_d8._0_8_ = local_130._16_8_;
  local_c0._M_elems[0] = (_Type)(_Type)local_130._16_8_;
  CVar42 = Eigen::internal::
           InnerMostDimReducer<Eigen::TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::MaxReducer<float,_0>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>,_Eigen::DefaultDevice>,_Eigen::internal::MaxReducer<float,_0>,_true,_true>
           ::reduce((TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::MaxReducer<float,_0>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                     *)local_118,0,local_118._8_8_,(MaxReducer<float,_0> *)&local_170);
  if ((float *)local_130._0_8_ == (float *)0x0) goto LAB_0034d3c0;
  *(CoeffReturnType *)local_130._0_8_ = CVar42;
  if (local_c8._M_elems[0] != 0) {
    free(*(void **)((long)local_c8._M_elems[0] + -8));
    local_c8._M_elems[0] = (_Type)0;
  }
  rVar43 = as_scalar(m);
  if ((x->d).bd != 1) goto LAB_0034d39e;
  uVar44 = (x->d).nd;
  uVar10 = (ulong)uVar44;
  if (uVar10 == 0) {
    uVar44 = 1;
LAB_0034cf76:
    if (uVar44 != (x->d).d[0]) {
LAB_0034d39e:
      __assert_fail("d.batch_elems() == 1 && (d.ndims() == 1 || d.size() == d.rows())",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                    ,0xba,"const Eigen::TensorMap<Eigen::Tensor<float, 1>> dynet::Tensor::t() const"
                   );
    }
  }
  else if (uVar44 != 1) {
    auVar16 = vpbroadcastq_avx512f();
    auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar12 = 0;
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar20 = vmovdqa64_avx512f(auVar17);
      auVar17 = vpbroadcastq_avx512f();
      auVar21 = vporq_avx512f(auVar17,auVar18);
      auVar17 = vporq_avx512f(auVar17,auVar19);
      uVar6 = vpcmpuq_avx512f(auVar17,auVar16,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar21,auVar16,2);
      bVar8 = (byte)uVar6;
      uVar14 = CONCAT11(bVar8,bVar7);
      auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])((x->d).d + uVar12));
      auVar26._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar17._4_4_;
      auVar26._0_4_ = (uint)(bVar7 & 1) * auVar17._0_4_;
      auVar26._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar17._8_4_;
      auVar26._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar17._12_4_;
      auVar26._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar17._16_4_;
      auVar26._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar17._20_4_;
      auVar26._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar17._24_4_;
      auVar26._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar17._28_4_;
      auVar26._32_4_ = (uint)(bVar8 & 1) * auVar17._32_4_;
      auVar26._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar17._36_4_;
      auVar26._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar17._40_4_;
      auVar26._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar17._44_4_;
      auVar26._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar17._48_4_;
      auVar26._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar17._52_4_;
      auVar26._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar17._56_4_;
      auVar26._60_4_ = (uint)(bVar8 >> 7) * auVar17._60_4_;
      auVar17 = vpmulld_avx512f(auVar26,auVar20);
      uVar12 = uVar12 + 0x10;
    } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
    auVar16 = vmovdqa32_avx512f(auVar17);
    auVar27._0_4_ = (uint)(bVar7 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
    bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
    auVar27._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * auVar20._4_4_;
    bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
    auVar27._8_4_ = (uint)bVar3 * auVar16._8_4_ | (uint)!bVar3 * auVar20._8_4_;
    bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
    auVar27._12_4_ = (uint)bVar3 * auVar16._12_4_ | (uint)!bVar3 * auVar20._12_4_;
    bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
    auVar27._16_4_ = (uint)bVar3 * auVar16._16_4_ | (uint)!bVar3 * auVar20._16_4_;
    bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
    auVar27._20_4_ = (uint)bVar3 * auVar16._20_4_ | (uint)!bVar3 * auVar20._20_4_;
    bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
    auVar27._24_4_ = (uint)bVar3 * auVar16._24_4_ | (uint)!bVar3 * auVar20._24_4_;
    bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
    auVar27._28_4_ = (uint)bVar3 * auVar16._28_4_ | (uint)!bVar3 * auVar20._28_4_;
    auVar27._32_4_ = (uint)(bVar8 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar27._36_4_ = (uint)bVar3 * auVar16._36_4_ | (uint)!bVar3 * auVar20._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar27._40_4_ = (uint)bVar3 * auVar16._40_4_ | (uint)!bVar3 * auVar20._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar27._44_4_ = (uint)bVar3 * auVar16._44_4_ | (uint)!bVar3 * auVar20._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar27._48_4_ = (uint)bVar3 * auVar16._48_4_ | (uint)!bVar3 * auVar20._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar27._52_4_ = (uint)bVar3 * auVar16._52_4_ | (uint)!bVar3 * auVar20._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar27._56_4_ = (uint)bVar3 * auVar16._56_4_ | (uint)!bVar3 * auVar20._56_4_;
    auVar27._60_4_ =
         (uint)(bVar8 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
    auVar15 = vextracti64x4_avx512f(auVar27,1);
    auVar16 = vpmulld_avx512f(auVar27,ZEXT3264(auVar15));
    auVar4 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    uVar44 = auVar4._0_4_;
    goto LAB_0034cf76;
  }
  uVar44 = 1;
  if (uVar10 != 0) {
    uVar44 = (x->d).d[0];
  }
  if ((z->d).bd == 1) {
    uVar10 = (ulong)(z->d).nd;
    if (uVar10 == 0) {
      iVar41 = 1;
    }
    else {
      auVar16 = vpbroadcastq_avx512f();
      auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar12 = 0;
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar20 = vmovdqa64_avx512f(auVar17);
        auVar17 = vpbroadcastq_avx512f();
        auVar21 = vporq_avx512f(auVar17,auVar18);
        auVar17 = vporq_avx512f(auVar17,auVar19);
        uVar6 = vpcmpuq_avx512f(auVar17,auVar16,2);
        bVar7 = (byte)uVar6;
        uVar6 = vpcmpuq_avx512f(auVar21,auVar16,2);
        bVar8 = (byte)uVar6;
        uVar14 = CONCAT11(bVar8,bVar7);
        auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])((z->d).d + uVar12));
        auVar35._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar17._4_4_;
        auVar35._0_4_ = (uint)(bVar7 & 1) * auVar17._0_4_;
        auVar35._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar17._8_4_;
        auVar35._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar17._12_4_;
        auVar35._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar17._16_4_;
        auVar35._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar17._20_4_;
        auVar35._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar17._24_4_;
        auVar35._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar17._28_4_;
        auVar35._32_4_ = (uint)(bVar8 & 1) * auVar17._32_4_;
        auVar35._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar17._36_4_;
        auVar35._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar17._40_4_;
        auVar35._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar17._44_4_;
        auVar35._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar17._48_4_;
        auVar35._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar17._52_4_;
        auVar35._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar17._56_4_;
        auVar35._60_4_ = (uint)(bVar8 >> 7) * auVar17._60_4_;
        auVar17 = vpmulld_avx512f(auVar35,auVar20);
        uVar12 = uVar12 + 0x10;
      } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
      auVar16 = vmovdqa32_avx512f(auVar17);
      auVar36._0_4_ = (uint)(bVar7 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
      bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * auVar20._4_4_;
      bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar3 * auVar16._8_4_ | (uint)!bVar3 * auVar20._8_4_;
      bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar3 * auVar16._12_4_ | (uint)!bVar3 * auVar20._12_4_;
      bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
      auVar36._16_4_ = (uint)bVar3 * auVar16._16_4_ | (uint)!bVar3 * auVar20._16_4_;
      bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
      auVar36._20_4_ = (uint)bVar3 * auVar16._20_4_ | (uint)!bVar3 * auVar20._20_4_;
      bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
      auVar36._24_4_ = (uint)bVar3 * auVar16._24_4_ | (uint)!bVar3 * auVar20._24_4_;
      bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
      auVar36._28_4_ = (uint)bVar3 * auVar16._28_4_ | (uint)!bVar3 * auVar20._28_4_;
      auVar36._32_4_ =
           (uint)(bVar8 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
      bVar3 = (bool)(bVar8 >> 1 & 1);
      auVar36._36_4_ = (uint)bVar3 * auVar16._36_4_ | (uint)!bVar3 * auVar20._36_4_;
      bVar3 = (bool)(bVar8 >> 2 & 1);
      auVar36._40_4_ = (uint)bVar3 * auVar16._40_4_ | (uint)!bVar3 * auVar20._40_4_;
      bVar3 = (bool)(bVar8 >> 3 & 1);
      auVar36._44_4_ = (uint)bVar3 * auVar16._44_4_ | (uint)!bVar3 * auVar20._44_4_;
      bVar3 = (bool)(bVar8 >> 4 & 1);
      auVar36._48_4_ = (uint)bVar3 * auVar16._48_4_ | (uint)!bVar3 * auVar20._48_4_;
      bVar3 = (bool)(bVar8 >> 5 & 1);
      auVar36._52_4_ = (uint)bVar3 * auVar16._52_4_ | (uint)!bVar3 * auVar20._52_4_;
      bVar3 = (bool)(bVar8 >> 6 & 1);
      auVar36._56_4_ = (uint)bVar3 * auVar16._56_4_ | (uint)!bVar3 * auVar20._56_4_;
      auVar36._60_4_ =
           (uint)(bVar8 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
      auVar15 = vextracti64x4_avx512f(auVar36,1);
      auVar16 = vpmulld_avx512f(auVar36,ZEXT3264(auVar15));
      auVar4 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
      auVar5 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(auVar4,0x55);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      iVar41 = auVar4._0_4_;
    }
    if (iVar41 == 1) {
      local_c8._M_elems[0] = (_Type)x->v;
      local_118._8_8_ = SEXT48((int)uVar44);
      local_130._0_8_ = z->v;
      local_130._16_8_ = dev->edevice;
      local_a8 = (DefaultDevice *)0x0;
      local_118[0] = (_Type)0x1;
      local_118._32_8_ = 1;
      local_118._24_8_ = local_118._8_8_;
      local_118._40_8_ = local_118._8_8_;
      local_118._48_8_ = local_130._16_8_;
      local_d8._0_8_ = local_130._16_8_;
      local_d8._8_4_ = rVar43;
      local_c0._M_elems[0] = (_Type)(_Type)local_118._8_8_;
      local_b8[0] = local_130._16_8_;
      local_a0.super_array<long,_1>._M_elems[0] = (array<long,_1>)(array<long,_1>)local_130._16_8_;
      CVar46 = Eigen::internal::
               InnerMostDimReducer<Eigen::TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::MakePointer>,_Eigen::DefaultDevice>,_Eigen::internal::SumReducer<float>,_true,_true>
               ::reduce((TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                         *)local_118,0,local_118._8_8_,(SumReducer<float> *)&local_170);
      if ((float *)local_130._0_8_ == (float *)0x0) {
LAB_0034d3c0:
        __function = 
        "CoeffReturnType &Eigen::TensorEvaluator<Eigen::TensorMap<Eigen::Tensor<float, 0>>, Eigen::DefaultDevice>::coeffRef(Index) [Derived = Eigen::TensorMap<Eigen::Tensor<float, 0>>, Device = Eigen::DefaultDevice]"
        ;
LAB_0034d309:
        __assert_fail("m_data != __null",
                      "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",100
                      ,__function);
      }
      *(CoeffReturnType *)local_130._0_8_ = CVar46;
      if (local_a8 != (DefaultDevice *)0x0) {
        free(*(void **)(local_a8 + -8));
        local_a8 = (DefaultDevice *)0x0;
      }
      if ((z->d).bd == 1) {
        uVar10 = (ulong)(z->d).nd;
        if (uVar10 == 0) {
          iVar41 = 1;
        }
        else {
          auVar16 = vpbroadcastq_avx512f();
          auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
          uVar12 = 0;
          auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          do {
            auVar20 = vmovdqa64_avx512f(auVar17);
            auVar17 = vpbroadcastq_avx512f();
            auVar21 = vporq_avx512f(auVar17,auVar18);
            auVar17 = vporq_avx512f(auVar17,auVar19);
            uVar6 = vpcmpuq_avx512f(auVar17,auVar16,2);
            bVar7 = (byte)uVar6;
            uVar6 = vpcmpuq_avx512f(auVar21,auVar16,2);
            bVar8 = (byte)uVar6;
            uVar14 = CONCAT11(bVar8,bVar7);
            auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])((z->d).d + uVar12));
            auVar37._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar17._4_4_;
            auVar37._0_4_ = (uint)(bVar7 & 1) * auVar17._0_4_;
            auVar37._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar17._8_4_;
            auVar37._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar17._12_4_;
            auVar37._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar17._16_4_;
            auVar37._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar17._20_4_;
            auVar37._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar17._24_4_;
            auVar37._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar17._28_4_;
            auVar37._32_4_ = (uint)(bVar8 & 1) * auVar17._32_4_;
            auVar37._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar17._36_4_;
            auVar37._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar17._40_4_;
            auVar37._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar17._44_4_;
            auVar37._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar17._48_4_;
            auVar37._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar17._52_4_;
            auVar37._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar17._56_4_;
            auVar37._60_4_ = (uint)(bVar8 >> 7) * auVar17._60_4_;
            auVar17 = vpmulld_avx512f(auVar37,auVar20);
            uVar12 = uVar12 + 0x10;
          } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
          auVar16 = vmovdqa32_avx512f(auVar17);
          auVar38._0_4_ =
               (uint)(bVar7 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
          bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar38._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * auVar20._4_4_;
          bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar38._8_4_ = (uint)bVar3 * auVar16._8_4_ | (uint)!bVar3 * auVar20._8_4_;
          bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar38._12_4_ = (uint)bVar3 * auVar16._12_4_ | (uint)!bVar3 * auVar20._12_4_;
          bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
          auVar38._16_4_ = (uint)bVar3 * auVar16._16_4_ | (uint)!bVar3 * auVar20._16_4_;
          bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
          auVar38._20_4_ = (uint)bVar3 * auVar16._20_4_ | (uint)!bVar3 * auVar20._20_4_;
          bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
          auVar38._24_4_ = (uint)bVar3 * auVar16._24_4_ | (uint)!bVar3 * auVar20._24_4_;
          bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
          auVar38._28_4_ = (uint)bVar3 * auVar16._28_4_ | (uint)!bVar3 * auVar20._28_4_;
          auVar38._32_4_ =
               (uint)(bVar8 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
          bVar3 = (bool)(bVar8 >> 1 & 1);
          auVar38._36_4_ = (uint)bVar3 * auVar16._36_4_ | (uint)!bVar3 * auVar20._36_4_;
          bVar3 = (bool)(bVar8 >> 2 & 1);
          auVar38._40_4_ = (uint)bVar3 * auVar16._40_4_ | (uint)!bVar3 * auVar20._40_4_;
          bVar3 = (bool)(bVar8 >> 3 & 1);
          auVar38._44_4_ = (uint)bVar3 * auVar16._44_4_ | (uint)!bVar3 * auVar20._44_4_;
          bVar3 = (bool)(bVar8 >> 4 & 1);
          auVar38._48_4_ = (uint)bVar3 * auVar16._48_4_ | (uint)!bVar3 * auVar20._48_4_;
          bVar3 = (bool)(bVar8 >> 5 & 1);
          auVar38._52_4_ = (uint)bVar3 * auVar16._52_4_ | (uint)!bVar3 * auVar20._52_4_;
          bVar3 = (bool)(bVar8 >> 6 & 1);
          auVar38._56_4_ = (uint)bVar3 * auVar16._56_4_ | (uint)!bVar3 * auVar20._56_4_;
          auVar38._60_4_ =
               (uint)(bVar8 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
          auVar15 = vextracti64x4_avx512f(auVar38,1);
          auVar16 = vpmulld_avx512f(auVar38,ZEXT3264(auVar15));
          auVar4 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
          auVar5 = vpshufd_avx(auVar4,0xee);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          auVar5 = vpshufd_avx(auVar4,0x55);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          iVar41 = auVar4._0_4_;
        }
        if (iVar41 == 1) {
          if (uVar10 == 0) {
            iVar41 = 1;
          }
          else {
            auVar16 = vpbroadcastq_avx512f();
            auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
            uVar12 = 0;
            auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            do {
              auVar20 = vmovdqa64_avx512f(auVar17);
              auVar17 = vpbroadcastq_avx512f();
              auVar21 = vporq_avx512f(auVar17,auVar18);
              auVar17 = vporq_avx512f(auVar17,auVar19);
              uVar6 = vpcmpuq_avx512f(auVar17,auVar16,2);
              bVar7 = (byte)uVar6;
              uVar6 = vpcmpuq_avx512f(auVar21,auVar16,2);
              bVar8 = (byte)uVar6;
              uVar14 = CONCAT11(bVar8,bVar7);
              auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])((z->d).d + uVar12));
              auVar39._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar17._4_4_;
              auVar39._0_4_ = (uint)(bVar7 & 1) * auVar17._0_4_;
              auVar39._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar17._8_4_;
              auVar39._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar17._12_4_;
              auVar39._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar17._16_4_;
              auVar39._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar17._20_4_;
              auVar39._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar17._24_4_;
              auVar39._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar17._28_4_;
              auVar39._32_4_ = (uint)(bVar8 & 1) * auVar17._32_4_;
              auVar39._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar17._36_4_;
              auVar39._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar17._40_4_;
              auVar39._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar17._44_4_;
              auVar39._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar17._48_4_;
              auVar39._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar17._52_4_;
              auVar39._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar17._56_4_;
              auVar39._60_4_ = (uint)(bVar8 >> 7) * auVar17._60_4_;
              auVar17 = vpmulld_avx512f(auVar39,auVar20);
              uVar12 = uVar12 + 0x10;
            } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
            auVar16 = vmovdqa32_avx512f(auVar17);
            auVar40._0_4_ =
                 (uint)(bVar7 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
            bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar40._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * auVar20._4_4_;
            bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar40._8_4_ = (uint)bVar3 * auVar16._8_4_ | (uint)!bVar3 * auVar20._8_4_;
            bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar40._12_4_ = (uint)bVar3 * auVar16._12_4_ | (uint)!bVar3 * auVar20._12_4_;
            bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar40._16_4_ = (uint)bVar3 * auVar16._16_4_ | (uint)!bVar3 * auVar20._16_4_;
            bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar40._20_4_ = (uint)bVar3 * auVar16._20_4_ | (uint)!bVar3 * auVar20._20_4_;
            bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar40._24_4_ = (uint)bVar3 * auVar16._24_4_ | (uint)!bVar3 * auVar20._24_4_;
            bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
            auVar40._28_4_ = (uint)bVar3 * auVar16._28_4_ | (uint)!bVar3 * auVar20._28_4_;
            auVar40._32_4_ =
                 (uint)(bVar8 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
            bVar3 = (bool)(bVar8 >> 1 & 1);
            auVar40._36_4_ = (uint)bVar3 * auVar16._36_4_ | (uint)!bVar3 * auVar20._36_4_;
            bVar3 = (bool)(bVar8 >> 2 & 1);
            auVar40._40_4_ = (uint)bVar3 * auVar16._40_4_ | (uint)!bVar3 * auVar20._40_4_;
            bVar3 = (bool)(bVar8 >> 3 & 1);
            auVar40._44_4_ = (uint)bVar3 * auVar16._44_4_ | (uint)!bVar3 * auVar20._44_4_;
            bVar3 = (bool)(bVar8 >> 4 & 1);
            auVar40._48_4_ = (uint)bVar3 * auVar16._48_4_ | (uint)!bVar3 * auVar20._48_4_;
            bVar3 = (bool)(bVar8 >> 5 & 1);
            auVar40._52_4_ = (uint)bVar3 * auVar16._52_4_ | (uint)!bVar3 * auVar20._52_4_;
            bVar3 = (bool)(bVar8 >> 6 & 1);
            auVar40._56_4_ = (uint)bVar3 * auVar16._56_4_ | (uint)!bVar3 * auVar20._56_4_;
            auVar40._60_4_ =
                 (uint)(bVar8 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
            auVar15 = vextracti64x4_avx512f(auVar40,1);
            auVar16 = vpmulld_avx512f(auVar40,ZEXT3264(auVar15));
            auVar4 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
            auVar5 = vpshufd_avx(auVar4,0xee);
            auVar4 = vpmulld_avx(auVar4,auVar5);
            auVar5 = vpshufd_avx(auVar4,0x55);
            auVar4 = vpmulld_avx(auVar4,auVar5);
            iVar41 = auVar4._0_4_;
          }
          if (iVar41 == 1) {
            pfVar2 = z->v;
            if (pfVar2 != (float *)0x0) {
              fVar47 = logf(*pfVar2);
              *pfVar2 = fVar47 + rVar43;
              return;
            }
            __assert_fail("m_data != __null",
                          "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h"
                          ,0x123,
                          "CoeffReturnType Eigen::TensorEvaluator<const Eigen::TensorMap<Eigen::Tensor<float, 0>>, Eigen::DefaultDevice>::coeff(Index) const [Derived = const Eigen::TensorMap<Eigen::Tensor<float, 0>>, Device = Eigen::DefaultDevice]"
                         );
          }
        }
      }
    }
  }
LAB_0034d37c:
  __assert_fail("d.batch_elems() == 1 && d.size() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                ,0xae,"Eigen::TensorMap<Eigen::Tensor<float, 0>> dynet::Tensor::t()");
}

Assistant:

EIGEN_STRONG_INLINE void logsumexp(const MyDevice & dev, const Tensor& x, Tensor & m, Tensor& z) {

  if(x.d.bd == 1) {
    m.t<0>().device(*dev.edevice) = x.t<1>().maximum();
    float mval = as_scalar(m);
    // This needs to be split into two lines to prevent memory allocation
    z.t<0>().device(*dev.edevice) = (x.t<1>() - mval).exp().sum();
    z.t<0>().device(*dev.edevice) = z.t<0>().log() + mval;
  } else {
    Eigen::array<int, 1> red_axis; red_axis[0] = 0;
    m.tb<0>().device(*dev.edevice) = x.tb<1>().maximum(red_axis);
    // TODO: We want to do this in a single command, but this is causing incorrect results.
    //  Eigen::array<int, 2> bcast({(int)x.d.rows(), 1});
    //  z.tb<0>().device(*dev.edevice) = (x.tb<1>() - m.tb<1>().broadcast(bcast)).exp().sum();
    //  z.tb<0>().device(*dev.edevice) = z.tb<0>().log() + m.tb<0>();
    // Do the following instead
    vector<float> mvals = as_vector(m);
    for(size_t b = 0; b < x.d.bd; b++) {
      // This needs to be split into two lines to prevent memory allocation
      z.tb<0>().chip<0>(b).device(*dev.edevice) = (x.tb<1>().chip<1>(b) - mvals[b]).exp().sum();
      z.tb<0>().chip<0>(b).device(*dev.edevice) = z.tb<0>().chip<0>(b).log() + mvals[b];
    }
  }
}